

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibBox.c
# Opt level: O0

If_Box_t * If_BoxStart(char *pName,int Id,int nPis,int nPos,int fSeq,int fBlack,int fOuter)

{
  If_Box_t *pIVar1;
  int *piVar2;
  If_Box_t *p;
  int fBlack_local;
  int fSeq_local;
  int nPos_local;
  int nPis_local;
  int Id_local;
  char *pName_local;
  
  pIVar1 = (If_Box_t *)calloc(1,0x20);
  pIVar1->pName = pName;
  pIVar1->Id = Id;
  pIVar1->fSeq = (char)fSeq;
  pIVar1->fBlack = (char)fBlack;
  pIVar1->fOuter = (char)fOuter;
  pIVar1->nPis = nPis;
  pIVar1->nPos = nPos;
  piVar2 = (int *)calloc((long)(nPis * nPos),4);
  pIVar1->pDelays = piVar2;
  return pIVar1;
}

Assistant:

If_Box_t * If_BoxStart( char * pName, int Id, int nPis, int nPos, int fSeq, int fBlack, int fOuter )
{
    If_Box_t * p;
    p = ABC_CALLOC( If_Box_t, 1 );
    p->pName   = pName; // consumes memory
    p->Id      = Id;
    p->fSeq    = (char)fSeq;
    p->fBlack  = (char)fBlack;
    p->fOuter  = (char)fOuter;
    p->nPis    = nPis;
    p->nPos    = nPos;
    p->pDelays = ABC_CALLOC( int, nPis * nPos );
    return p;
}